

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

X * __thiscall IMLE::predictStrongest(IMLE *this,Z *z)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  predictMultiple(this,z);
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->nSolFound;
  if (this->nSolFound < 1) {
    uVar2 = uVar3;
  }
  dVar5 = 0.0;
  uVar4 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar1 = (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3];
    if (dVar5 < dVar1) {
      uVar4 = uVar3 & 0xffffffff;
      dVar5 = dVar1;
    }
  }
  this->solIdx = (int)uVar4;
  return (this->predictions).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start + (int)uVar4;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predictStrongest(Z const &z)
{
    predictMultiple(z);

    Scal w = 0.0;
    int best = 0;
    for(int i=0; i < nSolFound; i++)
        if( predictionsWeight[i] > w )
        {
            w = predictionsWeight[i];
            best = i;
        }

    solIdx = best;

    //          Not needed, already in predict()
    // hasPredJacobian = false;
    // hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}